

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O2

int CVodeGetNumGEvals(void *cvode_mem,long *ngevals)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,0x5cb,"CVodeGetNumGEvals",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_io.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else {
    *ngevals = *(long *)((long)cvode_mem + 0x5c8);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeGetNumGEvals(void* cvode_mem, long int* ngevals)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  *ngevals = cv_mem->cv_nge;

  return (CV_SUCCESS);
}